

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O1

_Bool borg_activate_ring(wchar_t ring_sval)

{
  _Bool _Var1;
  char *what;
  long lVar2;
  
  lVar2 = (ulong)z_info->pack_size + 2;
  if ((((borg_items[lVar2].aware == true) && (borg_items[lVar2].tval == '\x15')) &&
      ((uint)borg_items[lVar2].sval == ring_sval)) &&
     ((borg_items[lVar2].timeout == 0 && (borg_items[lVar2].ident == true)))) {
    what = format("# Activating ring %s.");
    borg_note(what);
    borg_keypress(0x41);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                       [lVar2 - (ulong)z_info->pack_size]);
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool borg_activate_ring(int ring_sval)
{
    int i;

    /* Check the equipment */
    for (i = INVEN_RIGHT; i < INVEN_LEFT; i++) {
        borg_item *item = &borg_items[i];

        /*  Make Sure item is IDed */
        if (!item->aware)
            continue;

        /* Skip incorrect mails */
        if (item->tval != TV_RING)
            continue;
        if (item->sval != ring_sval)
            continue;

        /* Check charge */
        if (item->timeout)
            continue;

        /*  Make Sure item is IDed */
        if (!item->ident)
            continue;

        /* Log the message */
        borg_note(format("# Activating ring %s.", item->desc));

        /* Perform the action */
        borg_keypress('A');
        borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        /* Success */
        return true;
    }

    return false;
}